

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

size_t __thiscall miniscript::Node<XOnlyPubKey>::CalcScriptLen(Node<XOnlyPubKey> *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Fragment in_stack_00000024;
  size_t in_stack_00000030;
  shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *sub;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *__range2;
  size_t subsize;
  Type sub0type;
  iterator __end0;
  iterator __begin0;
  MiniscriptContext in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::begin((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::end((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  while (bVar2 = __gnu_cxx::
                 operator==<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                           ((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                             *)in_stack_ffffffffffffff98,
                            (__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    ScriptSize((Node<XOnlyPubKey> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  sVar3 = std::
          vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
          ::size((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (sVar3 != 0) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[](in_stack_ffffffffffffff98,
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    GetType((Node<XOnlyPubKey> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::size((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
          *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::size
            ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar4 = internal::ComputeScriptLen
                    (in_stack_00000024,sub._4_4_,in_stack_00000018,(uint32_t)sub,in_stack_00000010,
                     in_stack_00000030,in_stack_000000f0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return sVar4;
}

Assistant:

size_t CalcScriptLen() const {
        size_t subsize = 0;
        for (const auto& sub : subs) {
            subsize += sub->ScriptSize();
        }
        static constexpr auto NONE_MST{""_mst};
        Type sub0type = subs.size() > 0 ? subs[0]->GetType() : NONE_MST;
        return internal::ComputeScriptLen(fragment, sub0type, subsize, k, subs.size(), keys.size(), m_script_ctx);
    }